

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_data_exception(TCGContext_conflict12 *tcg_ctx,uint8_t dxc)

{
  uintptr_t o;
  TCGv_i32 pTVar1;
  undefined7 in_register_00000031;
  TCGTemp *local_28;
  TCGTemp *local_20;
  
  pTVar1 = tcg_const_i32_s390x(tcg_ctx,(int32_t)CONCAT71(in_register_00000031,dxc));
  local_28 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  local_20 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
  tcg_gen_callN_s390x(tcg_ctx,helper_data_exception,(TCGTemp *)0x0,2,&local_28);
  tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
  return;
}

Assistant:

static inline void gen_data_exception(TCGContext *tcg_ctx, uint8_t dxc)
{
    TCGv_i32 tmp = tcg_const_i32(tcg_ctx, dxc);
    gen_helper_data_exception(tcg_ctx, tcg_ctx->cpu_env, tmp);
    tcg_temp_free_i32(tcg_ctx, tmp);
}